

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_alloc_strategy.hpp
# Opt level: O1

void __thiscall foxxll::fully_random::fully_random(fully_random *this)

{
  uint uVar1;
  uint uVar2;
  random_device rStack_1398;
  
  striping::striping(&this->super_striping);
  std::random_device::random_device(&rStack_1398);
  uVar1 = std::random_device::_M_getval();
  uVar2 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  (this->rng_)._M_x = (ulong)(uVar2 + uVar1 + (uint)(uVar1 + uVar2 == 0));
  std::random_device::_M_fini();
  return;
}

Assistant:

fully_random() : striping() { }